

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O0

string * (anonymous_namespace)::StringPrintf_abi_cxx11_
                   (string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_518 [16];
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  allocator<char> local_449;
  undefined4 local_448;
  undefined4 local_444;
  va_list ap;
  char local_428 [8];
  char buf [1024];
  int N;
  char *format_local;
  
  if (in_AL != '\0') {
    local_4e8 = in_XMM0_Qa;
    local_4d8 = in_XMM1_Qa;
    local_4c8 = in_XMM2_Qa;
    local_4b8 = in_XMM3_Qa;
    local_4a8 = in_XMM4_Qa;
    local_498 = in_XMM5_Qa;
    local_488 = in_XMM6_Qa;
    local_478 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_518;
  ap[0]._0_8_ = &stack0x00000008;
  local_444 = 0x30;
  local_448 = 0x10;
  local_508 = in_RDX;
  local_500 = in_RCX;
  local_4f8 = in_R8;
  local_4f0 = in_R9;
  vsnprintf(local_428,0x400,format,&local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_428,&local_449);
  std::allocator<char>::~allocator(&local_449);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintf(const char* format, ...) {
  const int N = 1024;
  char buf[N];

  va_list ap;
  va_start(ap, format);
  vsnprintf(buf, N, format, ap);
  va_end(ap);

  return buf;
}